

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal_impl.hpp
# Opt level: O2

void __thiscall
sig::
Signal_impl<void_(const_cppurses::Glyph_string_&),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(const_cppurses::Glyph_string_&)>,_std::mutex>
::Connection_container::Connection_container(Connection_container *this,less<int> *compare)

{
  _Rb_tree_header *p_Var1;
  
  std::
  _Deque_base<std::shared_ptr<sig::Connection_impl<void_(const_cppurses::Glyph_string_&)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(const_cppurses::Glyph_string_&)>_>_>_>
  ::_Deque_base((_Deque_base<std::shared_ptr<sig::Connection_impl<void_(const_cppurses::Glyph_string_&)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(const_cppurses::Glyph_string_&)>_>_>_>
                 *)this);
  (this->grouped)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->grouped)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->grouped)._M_t._M_impl.super__Rb_tree_header;
  (this->grouped)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->grouped)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->grouped)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::
  _Deque_base<std::shared_ptr<sig::Connection_impl<void_(const_cppurses::Glyph_string_&)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(const_cppurses::Glyph_string_&)>_>_>_>
  ::_Deque_base(&(this->back).
                 super__Deque_base<std::shared_ptr<sig::Connection_impl<void_(const_cppurses::Glyph_string_&)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(const_cppurses::Glyph_string_&)>_>_>_>
               );
  return;
}

Assistant:

Connection_container(const Group_compare& compare) : grouped{compare} {}